

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGString.h
# Opt level: O1

String * SGParser::StringWithVAFormat<char>
                   (String *__return_storage_ptr__,char *format,__va_list_tag *argList)

{
  int iVar1;
  int iVar2;
  undefined8 uStack_48;
  va_list argList2;
  
  argList2[0].overflow_arg_area = argList->reg_save_area;
  uStack_48._0_4_ = argList->gp_offset;
  uStack_48._4_4_ = argList->fp_offset;
  argList2[0]._0_8_ = argList->overflow_arg_area;
  iVar1 = vsnprintf((char *)0x0,0,format,&uStack_48);
  if (iVar1 < 0) {
    __assert_fail("ilen >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/Kernel/SGString.h"
                  ,0x27,
                  "String SGParser::StringWithVAFormat(const CompatibleChar *, __va_list_tag *) [CompatibleChar = char]"
                 );
  }
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)iVar1 + '\x01');
    iVar2 = vsnprintf((__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length,format,argList);
    if (iVar2 != iVar1) {
      __assert_fail("ilen2 == ilen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/Kernel/SGString.h"
                    ,0x34,
                    "String SGParser::StringWithVAFormat(const CompatibleChar *, __va_list_tag *) [CompatibleChar = char]"
                   );
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String StringWithVAFormat(const CompatibleChar* format, va_list argList) {
    static_assert(std::is_integral_v<CompatibleChar> && sizeof(CompatibleChar) == 1u,
                  "String supports only single-byte character types, e.g. char or char8_t");

    // Determine required buffer-size:
    va_list argList2;
    va_copy(argList2, argList);
    const auto ilen = std::vsnprintf(nullptr, 0u, reinterpret_cast<const char*>(format), argList2);
    SG_ASSERT(ilen >= 0);  // if this fails, vsnprintf() discovered an error - possibly format-error
    va_end(argList2);

    if (ilen == 0)
        return String{};

    // Write it:
    String result(static_cast<size_t>(ilen) + 1u, CharT{});
    static_assert(sizeof(result.front()) == 1u, "String supports only single-byte character, e.g., char or char8_t");
    [[maybe_unused]] const auto ilen2 = std::vsnprintf(reinterpret_cast<char*>(result.data()),
                                                       result.size(),
                                                       reinterpret_cast<const char*>(format),
                                                       argList);
    SG_ASSERT(ilen2 == ilen);

    result.resize(static_cast<size_t>(ilen2));
    return result;
}